

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

void buf_grow(SBuf *sb,MSize sz)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  SBuf *bsb;
  GCSize flag;
  char *b;
  MSize nsz;
  MSize len;
  MSize osz;
  MSize sz_local;
  SBuf *sb_local;
  
  uVar3 = (int)sb->e - (int)sb->b;
  uVar4 = (int)sb->w - (int)sb->b;
  b._0_4_ = uVar3;
  if (uVar3 < 0x20) {
    b._0_4_ = 0x20;
  }
  for (; (uint)b < sz; b._0_4_ = (uint)b * 2) {
  }
  uVar1 = (sb->L).ptr64;
  if ((uVar1 & 2) == 0) {
    flag = (GCSize)lj_mem_realloc((lua_State *)((sb->L).ptr64 & 0xfffffffffffffff8),sb->b,
                                  (ulong)uVar3,(ulong)(uint)b);
  }
  else {
    flag = (GCSize)lj_mem_realloc((lua_State *)((sb->L).ptr64 & 0xfffffffffffffff8),(void *)0x0,0,
                                  (ulong)(uint)b);
    (sb->L).ptr64 = uVar1 & 0xfffffffffffffffd;
    sb[1].w = (char *)0x0;
    memcpy((void *)flag,sb->b,(ulong)uVar3);
  }
  if ((uVar1 & 1) != 0) {
    sb[1].e = sb[1].e + (flag - (long)sb->b);
  }
  sb->b = (char *)flag;
  sb->w = (char *)(flag + uVar4);
  sb->e = (char *)(flag + (uint)b);
  if ((uVar1 & 4) != 0) {
    plVar2 = (long *)sb[1].w;
    plVar2[2] = flag;
    *plVar2 = flag + uVar4;
    plVar2[1] = flag + (uint)b;
  }
  return;
}

Assistant:

static void buf_grow(SBuf *sb, MSize sz)
{
  MSize osz = sbufsz(sb), len = sbuflen(sb), nsz = osz;
  char *b;
  GCSize flag;
  if (nsz < LJ_MIN_SBUF) nsz = LJ_MIN_SBUF;
  while (nsz < sz) nsz += nsz;
  flag = sbufflag(sb);
  if ((flag & SBUF_FLAG_COW)) {  /* Copy-on-write semantics. */
    lj_assertG_(G(sbufL(sb)), sb->w == sb->e, "bad SBuf COW");
    b = (char *)lj_mem_new(sbufL(sb), nsz);
    setsbufflag(sb, flag & ~(GCSize)SBUF_FLAG_COW);
    setgcrefnull(sbufX(sb)->cowref);
    memcpy(b, sb->b, osz);
  } else {
    b = (char *)lj_mem_realloc(sbufL(sb), sb->b, osz, nsz);
  }
  if ((flag & SBUF_FLAG_EXT)) {
    sbufX(sb)->r = sbufX(sb)->r - sb->b + b;  /* Adjust read pointer, too. */
  }
  /* Adjust buffer pointers. */
  sb->b = b;
  sb->w = b + len;
  sb->e = b + nsz;
  if ((flag & SBUF_FLAG_BORROW)) {  /* Adjust borrowed buffer pointers. */
    SBuf *bsb = mref(sbufX(sb)->bsb, SBuf);
    bsb->b = b;
    bsb->w = b + len;
    bsb->e = b + nsz;
  }
}